

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# World.cpp
# Opt level: O0

void __thiscall
APhyBullet::BulletWorldDebugDrawer::drawTriangle
          (BulletWorldDebugDrawer *this,btVector3 *v0,btVector3 *v1,btVector3 *v2,btVector3 *color,
          btScalar alpha)

{
  BulletWorldDebugDrawer *in_RCX;
  btVector3 *in_RDI;
  undefined8 in_R8;
  undefined4 in_XMM0_Da;
  undefined4 in_stack_ffffffffffffffd0;
  float scalar;
  
  scalar = (float)((ulong)in_R8 >> 0x20);
  putOpcode((BulletWorldDebugDrawer *)CONCAT44(in_XMM0_Da,in_stack_ffffffffffffffd0),
            (aphy_debug_draw_opcode)((ulong)in_RDI >> 0x20));
  putVector3((BulletWorldDebugDrawer *)CONCAT44(in_XMM0_Da,in_stack_ffffffffffffffd0),in_RDI);
  putVector3((BulletWorldDebugDrawer *)CONCAT44(in_XMM0_Da,in_stack_ffffffffffffffd0),in_RDI);
  putVector3((BulletWorldDebugDrawer *)CONCAT44(in_XMM0_Da,in_stack_ffffffffffffffd0),in_RDI);
  putVector3((BulletWorldDebugDrawer *)CONCAT44(in_XMM0_Da,in_stack_ffffffffffffffd0),in_RDI);
  putScalar(in_RCX,scalar);
  return;
}

Assistant:

virtual	void drawTriangle(const btVector3& v0,const btVector3& v1,const btVector3& v2,const btVector3& color, btScalar alpha) override
    {
        putOpcode(APHY_DEBUG_DRAW_OP_TRIANGLE_FLAT);
        putVector3(v0);
        putVector3(v1);
        putVector3(v2);
        putVector3(color);
        putScalar(alpha);
    }